

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

size_t Curl_is_absolute_url(char *url,char *buf,size_t buflen,_Bool guess_scheme)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  if (buf != (char *)0x0) {
    *buf = '\0';
  }
  sVar5 = 0;
  do {
    if (sVar5 == 0x28) {
LAB_004a689e:
      if (url[sVar5] == ':') {
        sVar3 = 0;
        if (url[sVar5 + 1] == '/' || !guess_scheme) {
          sVar3 = sVar5;
        }
        if ((buf != (char *)0x0) && (url[sVar5 + 1] == '/' || !guess_scheme)) {
          cVar2 = '\0';
          sVar4 = sVar5;
          while( true ) {
            buf[sVar4] = cVar2;
            sVar3 = sVar5;
            if (sVar4 == 0) break;
            cVar2 = Curl_raw_tolower(url[sVar4 - 1]);
            sVar4 = sVar4 - 1;
          }
        }
      }
      else {
LAB_004a68e0:
        sVar3 = 0;
      }
      return sVar3;
    }
    bVar1 = url[sVar5];
    if ((bVar1 == 0) ||
       (((9 < (byte)(bVar1 - 0x30) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
        ((0x2e < bVar1 || ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0)))))) {
      if (sVar5 == 0) goto LAB_004a68e0;
      goto LAB_004a689e;
    }
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

size_t Curl_is_absolute_url(const char *url, char *buf, size_t buflen,
                            bool guess_scheme)
{
  int i;
  DEBUGASSERT(!buf || (buflen > MAX_SCHEME_LEN));
  (void)buflen; /* only used in debug-builds */
  if(buf)
    buf[0] = 0; /* always leave a defined value in buf */
#ifdef WIN32
  if(guess_scheme && STARTS_WITH_DRIVE_PREFIX(url))
    return 0;
#endif
  for(i = 0; i < MAX_SCHEME_LEN; ++i) {
    char s = url[i];
    if(s && (ISALNUM(s) || (s == '+') || (s == '-') || (s == '.') )) {
      /* RFC 3986 3.1 explains:
        scheme      = ALPHA *( ALPHA / DIGIT / "+" / "-" / "." )
      */
    }
    else {
      break;
    }
  }
  if(i && (url[i] == ':') && ((url[i + 1] == '/') || !guess_scheme)) {
    /* If this does not guess scheme, the scheme always ends with the colon so
       that this also detects data: URLs etc. In guessing mode, data: could
       be the host name "data" with a specified port number. */

    /* the length of the scheme is the name part only */
    size_t len = i;
    if(buf) {
      buf[i] = 0;
      while(i--) {
        buf[i] = Curl_raw_tolower(url[i]);
      }
    }
    return len;
  }
  return 0;
}